

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O1

Gia_Man_t * Abc_ManReadAig(char *pFileName,char *pToken)

{
  char cVar1;
  char *__haystack;
  undefined8 in_RAX;
  Vec_Str_t *__ptr;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  Gia_Man_t *pGVar5;
  long lVar6;
  char *pcVar7;
  uint sz;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  __ptr = Abc_ManReadFile(pFileName);
  if (__ptr == (Vec_Str_t *)0x0) {
    pGVar5 = (Gia_Man_t *)0x0;
  }
  else {
    __haystack = __ptr->pArray;
    pcVar2 = strstr(__haystack,pToken);
    if (pcVar2 == (char *)0x0) {
      pGVar5 = (Gia_Man_t *)0x0;
    }
    else {
      sVar3 = strlen(pToken);
      pcVar2 = pcVar2 + (sVar3 - 1);
      do {
        pcVar7 = pcVar2;
        pcVar2 = pcVar7 + 1;
        pcVar4 = pcVar2;
      } while (pcVar7[1] == ' ');
      for (; cVar1 = *pcVar4, cVar1 != '\0'; pcVar4 = pcVar4 + 1) {
        if ((cVar1 == '\r') || (cVar1 == '\n')) {
          *pcVar4 = '\0';
          break;
        }
      }
      __isoc99_sscanf(pcVar2,"%u ",&local_24);
      pcVar4 = pcVar2;
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != ' ');
      if (local_24 != 0) {
        lVar6 = 0;
        do {
          pcVar2[lVar6] = pcVar4[1] << 6 | *pcVar4 - 0x30U;
          pcVar7[lVar6 + 2] =
               pcVar4[2] << 4 | (byte)((uint)(pcVar4[1] * 0x400000 + -0xc000000) >> 0x18);
          pcVar7[lVar6 + 3] =
               pcVar4[3] * '\x04' + 0x40U |
               (byte)((uint)(pcVar4[2] * 0x100000 + -0x3000000) >> 0x18);
          pcVar4 = pcVar4 + 4;
          lVar6 = lVar6 + 3;
        } while ((uint)lVar6 < local_24);
      }
      pGVar5 = Gia_AigerReadFromMemory(pcVar2,local_24,0,0);
    }
    if (__haystack != (char *)0x0) {
      free(__haystack);
      __ptr->pArray = (char *)0x0;
    }
    free(__ptr);
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Abc_ManReadAig( char * pFileName, char * pToken )
{
    Gia_Man_t * pGia = NULL;
    unsigned nBinaryPart;
    Vec_Str_t * vStr;
    char * pStr, * pEnd;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return NULL;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
    {
        // skip token
        pStr += strlen(pToken);
        // skip spaces
        while ( *pStr == ' ' )
            pStr++;
        // set the end at newline
        for ( pEnd = pStr; *pEnd; pEnd++ )
            if ( *pEnd == '\r' || *pEnd == '\n' )
            {
                *pEnd = 0;
                break;
            }
        // convert into binary AIGER
        nBinaryPart = textToBin( pStr, strlen(pStr) );
        // dump it into file
        if ( 0 )
        {
            FILE * pFile = fopen( "test.aig", "wb" );
            fwrite( pStr, 1, nBinaryPart, pFile );
            fclose( pFile );
        }
        // derive AIG
        pGia = Gia_AigerReadFromMemory( pStr, nBinaryPart, 0, 0 ); 
    }
    Vec_StrFree( vStr );
    return pGia;

}